

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CLayer_*,_allocator_default<CLayer_*>_>::remove
          (array<CLayer_*,_allocator_default<CLayer_*>_> *this,char *__filename)

{
  uint uVar1;
  CLayer **extraout_RAX;
  CLayer **ppCVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->num_elements;
  ppCVar2 = this->list;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    if (uVar3 == uVar4) {
LAB_0019c793:
      return (int)CONCAT71((int7)((ulong)ppCVar2 >> 8),(long)uVar4 < (long)(int)uVar1);
    }
    if (ppCVar2[uVar4] == *(CLayer **)__filename) {
      remove_index(this,(int)uVar4);
      ppCVar2 = extraout_RAX;
      goto LAB_0019c793;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}